

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O2

bool __thiscall
nanoflann::
KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,double>,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,3,unsigned_long>
::searchLevel<nanoflann::KNNResultSet<double,unsigned_long,unsigned_long>>
          (KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,double>,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,3,unsigned_long>
           *this,KNNResultSet<double,_unsigned_long,_unsigned_long> *result_set,ElementType *vec,
          NodePtr node,DistanceType mindistsq,distance_vector_t *dists,float epsError)

{
  int iVar1;
  NodePtr pNVar2;
  double dVar3;
  NodePtr node_00;
  bool bVar4;
  bool bVar5;
  NodePtr node_01;
  unsigned_long uVar6;
  ulong uVar7;
  double dVar8;
  DistanceType dist;
  double mindistsq_00;
  
  pNVar2 = node->child1;
  if ((pNVar2 == (NodePtr)0x0) && (node->child2 == (Node *)0x0)) {
    dVar3 = result_set->dists[result_set->capacity - 1];
    uVar6 = (node->node_type).lr.left;
    while ((bVar4 = (node->node_type).lr.right <= uVar6, !bVar4 &&
           ((dist = L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>
                    ::evalMetric((L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>
                                  *)(this + 0xa8),vec,*(size_t *)(*(long *)this + uVar6 * 8),3),
            dVar3 <= dist ||
            (bVar5 = KNNResultSet<double,_unsigned_long,_unsigned_long>::addPoint
                               (result_set,dist,*(IndexType *)(*(long *)this + uVar6 * 8)), bVar5)))
           )) {
      uVar6 = uVar6 + 1;
    }
  }
  else {
    iVar1 = (node->node_type).sub.divfeat;
    dVar3 = vec[iVar1] - (node->node_type).sub.divlow;
    dVar8 = vec[iVar1] - (node->node_type).sub.divhigh;
    node_01 = pNVar2;
    node_00 = node->child2;
    if (dVar3 + dVar8 < 0.0) {
      node_01 = node->child2;
      node_00 = pNVar2;
    }
    bVar4 = searchLevel<nanoflann::KNNResultSet<double,unsigned_long,unsigned_long>>
                      (this,result_set,vec,node_00,mindistsq,dists,epsError);
    if (bVar4) {
      uVar7 = -(ulong)(dVar3 + dVar8 < 0.0);
      dVar8 = (double)(~uVar7 & (ulong)(dVar3 * dVar3) | (ulong)(dVar8 * dVar8) & uVar7);
      dVar3 = dists->_M_elems[iVar1];
      mindistsq_00 = (mindistsq + dVar8) - dVar3;
      dists->_M_elems[iVar1] = dVar8;
      if ((result_set->dists[result_set->capacity - 1] < (double)epsError * mindistsq_00) ||
         (bVar4 = searchLevel<nanoflann::KNNResultSet<double,unsigned_long,unsigned_long>>
                            (this,result_set,vec,node_01,mindistsq_00,dists,epsError), bVar4)) {
        dists->_M_elems[iVar1] = dVar3;
        return true;
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool searchLevel(RESULTSET &result_set, const ElementType *vec,
                   const NodePtr node, DistanceType mindistsq,
                   distance_vector_t &dists, const float epsError) const {
    /* If this is a leaf node, then do check and return. */
    if ((node->child1 == NULL) && (node->child2 == NULL)) {
      // count_leaf += (node->lr.right-node->lr.left);  // Removed since was
      // neither used nor returned to the user.
      DistanceType worst_dist = result_set.worstDist();
      for (IndexType i = node->node_type.lr.left; i < node->node_type.lr.right;
           ++i) {
        const IndexType index = BaseClassRef::vind[i]; // reorder... : i;
        DistanceType dist = distance.evalMetric(
            vec, index, (DIM > 0 ? DIM : BaseClassRef::dim));
        if (dist < worst_dist) {
          if (!result_set.addPoint(dist, BaseClassRef::vind[i])) {
            // the resultset doesn't want to receive any more points, we're done
            // searching!
            return false;
          }
        }
      }
      return true;
    }

    /* Which child branch should be taken first? */
    int idx = node->node_type.sub.divfeat;
    ElementType val = vec[idx];
    DistanceType diff1 = val - node->node_type.sub.divlow;
    DistanceType diff2 = val - node->node_type.sub.divhigh;

    NodePtr bestChild;
    NodePtr otherChild;
    DistanceType cut_dist;
    if ((diff1 + diff2) < 0) {
      bestChild = node->child1;
      otherChild = node->child2;
      cut_dist = distance.accum_dist(val, node->node_type.sub.divhigh, idx);
    } else {
      bestChild = node->child2;
      otherChild = node->child1;
      cut_dist = distance.accum_dist(val, node->node_type.sub.divlow, idx);
    }

    /* Call recursively to search next level down. */
    if (!searchLevel(result_set, vec, bestChild, mindistsq, dists, epsError)) {
      // the resultset doesn't want to receive any more points, we're done
      // searching!
      return false;
    }

    DistanceType dst = dists[idx];
    mindistsq = mindistsq + cut_dist - dst;
    dists[idx] = cut_dist;
    if (mindistsq * epsError <= result_set.worstDist()) {
      if (!searchLevel(result_set, vec, otherChild, mindistsq, dists,
                       epsError)) {
        // the resultset doesn't want to receive any more points, we're done
        // searching!
        return false;
      }
    }
    dists[idx] = dst;
    return true;
  }